

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O0

int value_for_key_as_uint16(MMDB_entry_s *start,char *key,uint16_t *value)

{
  char *pcStack_68;
  int status;
  char *path [2];
  MMDB_entry_data_s entry_data;
  uint16_t *value_local;
  char *key_local;
  MMDB_entry_s *start_local;
  
  path[0] = (char *)0x0;
  pcStack_68 = key;
  start_local._4_4_ =
       MMDB_aget_value(start,(MMDB_entry_data_s *)(path + 1),&stack0xffffffffffffff98);
  if (start_local._4_4_ == 0) {
    if (entry_data.offset_to_next == 5) {
      *value = entry_data._8_2_;
      start_local._4_4_ = 0;
    }
    else {
      start_local._4_4_ = 3;
    }
  }
  return start_local._4_4_;
}

Assistant:

static int
value_for_key_as_uint16(MMDB_entry_s *start, char *key, uint16_t *value) {
    MMDB_entry_data_s entry_data;
    const char *path[] = {key, NULL};
    int status = MMDB_aget_value(start, &entry_data, path);
    if (MMDB_SUCCESS != status) {
        return status;
    }
    if (MMDB_DATA_TYPE_UINT16 != entry_data.type) {
        DEBUG_MSGF("expect uint16 for %s but received %s",
                   key,
                   type_num_to_name(entry_data.type));
        return MMDB_INVALID_METADATA_ERROR;
    }
    *value = entry_data.uint16;
    return MMDB_SUCCESS;
}